

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O0

bool tinyusdz::CastToXformable(Prim *prim,Xformable **xformable)

{
  GPrim *pGVar1;
  Xformable *pXVar2;
  GeomMesh *pGVar3;
  GeomBasisCurves *pGVar4;
  GeomCube *pGVar5;
  GeomSphere *pGVar6;
  GeomCylinder *pGVar7;
  GeomCone *pGVar8;
  GeomCapsule *pGVar9;
  GeomPoints *pGVar10;
  GeomCamera *pGVar11;
  SkelRoot *pSVar12;
  Skeleton *pSVar13;
  RectLight *pRVar14;
  DomeLight *pDVar15;
  CylinderLight *pCVar16;
  SphereLight *pSVar17;
  DiskLight *pDVar18;
  DistantLight *pDVar19;
  GeometryLight *pGVar20;
  PluginLight *pPVar21;
  Skeleton *pv_24;
  SkelRoot *pv_23;
  PluginLight *pv_22;
  PortalLight *pv_21;
  GeometryLight *pv_20;
  RectLight *pv_19;
  DistantLight *pv_18;
  DiskLight *pv_17;
  SphereLight *pv_16;
  CylinderLight *pv_15;
  DomeLight *pv_14;
  RectLight *pv_13;
  Skeleton *pv_12;
  SkelRoot *pv_11;
  GeomCamera *pv_10;
  GeomPoints *pv_9;
  GeomCapsule *pv_8;
  GeomCone *pv_7;
  GeomCylinder *pv_6;
  GeomSphere *pv_5;
  GeomCube *pv_4;
  GeomBasisCurves *pv_3;
  GeomMesh *pv_2;
  Xform *pv_1;
  GPrim *pv;
  Xformable **xformable_local;
  Prim *prim_local;
  
  if (xformable == (Xformable **)0x0) {
    prim_local._7_1_ = false;
  }
  else {
    pGVar1 = Prim::as<tinyusdz::GPrim>(prim);
    if (pGVar1 == (GPrim *)0x0) {
      pXVar2 = (Xformable *)Prim::as<tinyusdz::Xform>(prim);
      if (pXVar2 == (Xformable *)0x0) {
        pGVar3 = Prim::as<tinyusdz::GeomMesh>(prim);
        if (pGVar3 == (GeomMesh *)0x0) {
          pGVar4 = Prim::as<tinyusdz::GeomBasisCurves>(prim);
          if (pGVar4 == (GeomBasisCurves *)0x0) {
            pGVar5 = Prim::as<tinyusdz::GeomCube>(prim);
            if (pGVar5 == (GeomCube *)0x0) {
              pGVar6 = Prim::as<tinyusdz::GeomSphere>(prim);
              if (pGVar6 == (GeomSphere *)0x0) {
                pGVar7 = Prim::as<tinyusdz::GeomCylinder>(prim);
                if (pGVar7 == (GeomCylinder *)0x0) {
                  pGVar8 = Prim::as<tinyusdz::GeomCone>(prim);
                  if (pGVar8 == (GeomCone *)0x0) {
                    pGVar9 = Prim::as<tinyusdz::GeomCapsule>(prim);
                    if (pGVar9 == (GeomCapsule *)0x0) {
                      pGVar10 = Prim::as<tinyusdz::GeomPoints>(prim);
                      if (pGVar10 == (GeomPoints *)0x0) {
                        pGVar11 = Prim::as<tinyusdz::GeomCamera>(prim);
                        if (pGVar11 == (GeomCamera *)0x0) {
                          pSVar12 = Prim::as<tinyusdz::SkelRoot>(prim);
                          if (pSVar12 == (SkelRoot *)0x0) {
                            pSVar13 = Prim::as<tinyusdz::Skeleton>(prim);
                            if (pSVar13 == (Skeleton *)0x0) {
                              pRVar14 = Prim::as<tinyusdz::RectLight>(prim);
                              if (pRVar14 == (RectLight *)0x0) {
                                pDVar15 = Prim::as<tinyusdz::DomeLight>(prim);
                                if (pDVar15 == (DomeLight *)0x0) {
                                  pCVar16 = Prim::as<tinyusdz::CylinderLight>(prim);
                                  if (pCVar16 == (CylinderLight *)0x0) {
                                    pSVar17 = Prim::as<tinyusdz::SphereLight>(prim);
                                    if (pSVar17 == (SphereLight *)0x0) {
                                      pDVar18 = Prim::as<tinyusdz::DiskLight>(prim);
                                      if (pDVar18 == (DiskLight *)0x0) {
                                        pDVar19 = Prim::as<tinyusdz::DistantLight>(prim);
                                        if (pDVar19 == (DistantLight *)0x0) {
                                          pRVar14 = Prim::as<tinyusdz::RectLight>(prim);
                                          if (pRVar14 == (RectLight *)0x0) {
                                            pGVar20 = Prim::as<tinyusdz::GeometryLight>(prim);
                                            if (pGVar20 == (GeometryLight *)0x0) {
                                              pXVar2 = (Xformable *)
                                                       Prim::as<tinyusdz::PortalLight>(prim);
                                              if (pXVar2 == (Xformable *)0x0) {
                                                pPVar21 = Prim::as<tinyusdz::PluginLight>(prim);
                                                if (pPVar21 == (PluginLight *)0x0) {
                                                  pSVar12 = Prim::as<tinyusdz::SkelRoot>(prim);
                                                  if (pSVar12 == (SkelRoot *)0x0) {
                                                    pSVar13 = Prim::as<tinyusdz::Skeleton>(prim);
                                                    if (pSVar13 == (Skeleton *)0x0) {
                                                      prim_local._7_1_ = false;
                                                    }
                                                    else {
                                                      *xformable = &pSVar13->super_Xformable;
                                                      prim_local._7_1_ = true;
                                                    }
                                                  }
                                                  else {
                                                    *xformable = &pSVar12->super_Xformable;
                                                    prim_local._7_1_ = true;
                                                  }
                                                }
                                                else {
                                                  *xformable = &pPVar21->super_Xformable;
                                                  prim_local._7_1_ = true;
                                                }
                                              }
                                              else {
                                                *xformable = pXVar2;
                                                prim_local._7_1_ = true;
                                              }
                                            }
                                            else {
                                              *xformable = (Xformable *)pGVar20;
                                              prim_local._7_1_ = true;
                                            }
                                          }
                                          else {
                                            *xformable = (Xformable *)pRVar14;
                                            prim_local._7_1_ = true;
                                          }
                                        }
                                        else {
                                          *xformable = (Xformable *)pDVar19;
                                          prim_local._7_1_ = true;
                                        }
                                      }
                                      else {
                                        *xformable = (Xformable *)pDVar18;
                                        prim_local._7_1_ = true;
                                      }
                                    }
                                    else {
                                      *xformable = (Xformable *)pSVar17;
                                      prim_local._7_1_ = true;
                                    }
                                  }
                                  else {
                                    *xformable = (Xformable *)pCVar16;
                                    prim_local._7_1_ = true;
                                  }
                                }
                                else {
                                  *xformable = (Xformable *)pDVar15;
                                  prim_local._7_1_ = true;
                                }
                              }
                              else {
                                *xformable = (Xformable *)pRVar14;
                                prim_local._7_1_ = true;
                              }
                            }
                            else {
                              *xformable = &pSVar13->super_Xformable;
                              prim_local._7_1_ = true;
                            }
                          }
                          else {
                            *xformable = &pSVar12->super_Xformable;
                            prim_local._7_1_ = true;
                          }
                        }
                        else {
                          *xformable = (Xformable *)pGVar11;
                          prim_local._7_1_ = true;
                        }
                      }
                      else {
                        *xformable = (Xformable *)pGVar10;
                        prim_local._7_1_ = true;
                      }
                    }
                    else {
                      *xformable = (Xformable *)pGVar9;
                      prim_local._7_1_ = true;
                    }
                  }
                  else {
                    *xformable = (Xformable *)pGVar8;
                    prim_local._7_1_ = true;
                  }
                }
                else {
                  *xformable = (Xformable *)pGVar7;
                  prim_local._7_1_ = true;
                }
              }
              else {
                *xformable = (Xformable *)pGVar6;
                prim_local._7_1_ = true;
              }
            }
            else {
              *xformable = (Xformable *)pGVar5;
              prim_local._7_1_ = true;
            }
          }
          else {
            *xformable = (Xformable *)pGVar4;
            prim_local._7_1_ = true;
          }
        }
        else {
          *xformable = (Xformable *)pGVar3;
          prim_local._7_1_ = true;
        }
      }
      else {
        *xformable = pXVar2;
        prim_local._7_1_ = true;
      }
    }
    else {
      *xformable = &pGVar1->super_Xformable;
      prim_local._7_1_ = true;
    }
  }
  return prim_local._7_1_;
}

Assistant:

bool CastToXformable(const Prim &prim, const Xformable **xformable) {
  if (!xformable) {
    return false;
  }

  // __ty = class derived from Xformable.
#define TRY_CAST(__ty)             \
  if (auto pv = prim.as<__ty>()) { \
    (*xformable) = pv;             \
    return true;                   \
  }

  // TODO: Use tydra::ApplyToXformable
  TRY_CAST(GPrim)
  TRY_CAST(Xform)
  TRY_CAST(GeomMesh)
  TRY_CAST(GeomBasisCurves)
  TRY_CAST(GeomCube)
  TRY_CAST(GeomSphere)
  TRY_CAST(GeomCylinder)
  TRY_CAST(GeomCone)
  TRY_CAST(GeomCapsule)
  TRY_CAST(GeomPoints)
  // TRY_CAST(GeomPointInstancer)
  TRY_CAST(GeomCamera)
  TRY_CAST(SkelRoot)
  TRY_CAST(Skeleton)
  TRY_CAST(RectLight)
  TRY_CAST(DomeLight)
  TRY_CAST(CylinderLight)
  TRY_CAST(SphereLight)
  TRY_CAST(DiskLight)
  TRY_CAST(DistantLight)
  TRY_CAST(RectLight)
  TRY_CAST(GeometryLight)
  TRY_CAST(PortalLight)
  TRY_CAST(PluginLight)
  TRY_CAST(SkelRoot)
  TRY_CAST(Skeleton)

  return false;
}